

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

Real __thiscall amrex::MultiFab::norm2(MultiFab *this,int comp,Periodicity *period)

{
  double dVar1;
  long lVar2;
  int j;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Real RVar11;
  double local_160;
  undefined1 local_150 [64];
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  OverlapMask((MultiFab *)local_150,(Periodicity *)this);
  local_150._16_8_ = this;
  MFIter::MFIter(&mfi,(FabArrayBase *)this,true);
  local_150._8_8_ = (long)comp << 3;
  local_160 = 0.0;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox((Box *)(local_150 + 0x24),&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,(FabArray<amrex::FArrayBox> *)local_150._16_8_,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_d0,(FabArray<amrex::FArrayBox> *)local_150._0_8_,&mfi);
    lVar2 = (long)(int)local_150._36_4_;
    lVar9 = (long)(int)local_150._40_4_;
    lVar4 = (long)(int)local_150._44_4_;
    local_150._24_8_ = local_d0.kstride * 8;
    lVar6 = (lVar9 - local_d0.begin.y) * local_d0.jstride * 8 +
            (lVar4 - local_d0.begin.z) * local_150._24_8_ + lVar2 * 8 + (long)local_d0.begin.x * -8
            + (long)local_d0.p;
    lVar5 = local_110.nstride * local_150._8_8_ +
            (lVar9 - local_110.begin.y) * local_110.jstride * 8 +
            (lVar4 - local_110.begin.z) * local_110.kstride * 8 + lVar2 * 8 +
            (long)local_110.begin.x * -8 + (long)local_110.p;
    for (; lVar3 = lVar9, lVar7 = lVar6, lVar8 = lVar5, lVar4 <= (int)local_150._56_4_;
        lVar4 = lVar4 + 1) {
      for (; lVar3 <= (int)local_150._52_4_; lVar3 = lVar3 + 1) {
        for (lVar10 = 0; lVar2 + lVar10 <= (long)(int)local_150._48_4_; lVar10 = lVar10 + 1) {
          dVar1 = *(double *)(lVar8 + lVar10 * 8);
          local_160 = local_160 + (dVar1 * dVar1) / *(double *)(lVar7 + lVar10 * 8);
        }
        lVar7 = lVar7 + local_d0.jstride * 8;
        lVar8 = lVar8 + local_110.jstride * 8;
      }
      lVar6 = lVar6 + local_150._24_8_;
      lVar5 = lVar5 + local_110.kstride * 8;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  if (local_160 < 0.0) {
    RVar11 = sqrt(local_160);
  }
  else {
    RVar11 = SQRT(local_160);
  }
  if ((FabArray<amrex::FArrayBox> *)local_150._0_8_ != (FabArray<amrex::FArrayBox> *)0x0) {
    (*((FabArrayBase *)local_150._0_8_)->_vptr_FabArrayBase[1])();
  }
  return RVar11;
}

Assistant:

Real
MultiFab::norm2 (int comp, const Periodicity& period) const
{
    BL_PROFILE("MultiFab::norm2(period)");

    Real nm2 = Real(0.0);

    auto mask = OverlapMask(period);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& maskma = mask->const_arrays();
        nm2 = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, *this,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            Real tmp = ma[box_no](i,j,k,comp);
            return tmp*tmp/maskma[box_no](i,j,k);
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:nm2)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            auto const& a = this->const_array(mfi);
            auto const& m = mask->const_array(mfi);
            AMREX_LOOP_3D(bx, i, j, k,
            {
                Real tmp = a(i,j,k,comp);
                nm2 += tmp*tmp/m(i,j,k);
            });
        }
    }

    ParallelAllReduce::Sum(nm2, ParallelContext::CommunicatorSub());
    return std::sqrt(nm2);
}